

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void * base_alloc_impl(tsdn_t *tsdn,base_t *base,size_t size,size_t alignment,size_t *esn)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  extent_hooks_t *extent_hooks;
  int iVar3;
  uint uVar4;
  extent_t *extent;
  base_block_t *pbVar5;
  ulong alignment_00;
  void *addr;
  size_t sVar6;
  long lVar7;
  ulong size_00;
  
  alignment_00 = alignment + 0xf & 0xfffffffffffffff0;
  size_00 = (alignment_00 + size) - 1 & -alignment_00;
  __mutex = (pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x40);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  sVar6 = (alignment_00 + size_00) - 0x10;
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (sVar6 < 0x1001) {
    uVar4 = (uint)sz_size2index_tab[(alignment_00 + size_00) - 9 >> 3];
  }
  else {
    uVar4 = sz_size2index_compute(sVar6);
  }
  if (uVar4 < 0xe8) {
    lVar7 = (ulong)uVar4 << 3;
    do {
      extent = extent_heap_remove_first((extent_heap_t *)((long)&base->avail[0].ph_root + lVar7));
      if (extent != (extent_t *)0x0) goto LAB_0011a79c;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x740);
  }
  extent_hooks = (extent_hooks_t *)(base->extent_hooks).repr;
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  pbVar5 = base_block_alloc(tsdn,base,extent_hooks,base->ind,&base->pind_last,&base->extent_sn_next,
                            size_00,alignment_00);
  iVar3 = pthread_mutex_trylock(__mutex);
  if (iVar3 != 0) {
    malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if (pbVar5 == (base_block_t *)0x0) {
    addr = (void *)0x0;
  }
  else {
    pbVar5->next = base->blocks;
    base->blocks = pbVar5;
    base->allocated = base->allocated + 0x90;
    base->resident = base->resident + 0x1000;
    base->mapped = base->mapped + pbVar5->size;
    if (((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default))
       && ((opt_metadata_thp != metadata_thp_auto || (base->auto_thp_switched == true)))) {
      base->n_thp = base->n_thp + 1;
    }
    extent = &pbVar5->extent;
LAB_0011a79c:
    addr = (void *)((alignment_00 - 1) + (long)extent->e_addr & -alignment_00);
    sVar6 = (long)addr - (long)extent->e_addr;
    extent->e_addr = (void *)((long)addr + size_00);
    (extent->field_2).e_size_esn = (extent->field_2).e_size_esn - (sVar6 + size_00);
    extent->e_bits = extent->e_bits & 0xfffffffffc000000 | 0x3a0efff;
    base_extent_bump_alloc_post(base,extent,sVar6,addr,size_00);
    if (esn != (size_t *)0x0) {
      *esn = extent->e_bits >> 0x2a;
    }
  }
  (base->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return addr;
}

Assistant:

static void *
base_alloc_impl(tsdn_t *tsdn, base_t *base, size_t size, size_t alignment,
    size_t *esn) {
	alignment = QUANTUM_CEILING(alignment);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t asize = usize + alignment - QUANTUM;

	extent_t *extent = NULL;
	malloc_mutex_lock(tsdn, &base->mtx);
	for (szind_t i = sz_size2index(asize); i < SC_NSIZES; i++) {
		extent = extent_heap_remove_first(&base->avail[i]);
		if (extent != NULL) {
			/* Use existing space. */
			break;
		}
	}
	if (extent == NULL) {
		/* Try to allocate more space. */
		extent = base_extent_alloc(tsdn, base, usize, alignment);
	}
	void *ret;
	if (extent == NULL) {
		ret = NULL;
		goto label_return;
	}

	ret = base_extent_bump_alloc(base, extent, usize, alignment);
	if (esn != NULL) {
		*esn = extent_sn_get(extent);
	}
label_return:
	malloc_mutex_unlock(tsdn, &base->mtx);
	return ret;
}